

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_api.c
# Opt level: O1

void solver_rebuild_order(solver_t *s)

{
  ulong uVar1;
  uint uVar2;
  heap_t *phVar3;
  vec_uint_t *pvVar4;
  vec_int_t *pvVar5;
  long lVar6;
  sdbl_t *psVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  uint *__ptr;
  void *pvVar11;
  vec_char_t *pvVar12;
  uint *puVar13;
  uint uVar14;
  char *__function;
  uint uVar15;
  char *__file;
  char *__assertion;
  uint uVar16;
  ulong uVar17;
  uint uVar18;
  uint uVar19;
  ulong uVar20;
  
  uVar15 = s->assigns->size;
  __ptr = (uint *)malloc(0x10);
  uVar14 = 0x10;
  if (0xe < uVar15 - 1) {
    uVar14 = uVar15;
  }
  __ptr[1] = 0;
  *__ptr = uVar14;
  if (uVar14 == 0) {
    pvVar11 = (void *)0x0;
  }
  else {
    pvVar11 = malloc((ulong)uVar14 << 2);
  }
  *(void **)(__ptr + 2) = pvVar11;
  pvVar12 = s->assigns;
  if (pvVar12->size != 0) {
    uVar20 = 0;
    do {
      if (pvVar12->data[uVar20] == '\x03') {
        uVar15 = *__ptr;
        uVar14 = __ptr[1];
        if (uVar14 == uVar15) {
          if (uVar15 < 0x10) {
            pvVar11 = realloc(*(void **)(__ptr + 2),0x40);
            *(void **)(__ptr + 2) = pvVar11;
            uVar15 = 0x10;
            if (pvVar11 == (void *)0x0) goto LAB_00554e3b;
          }
          else {
            if ((int)uVar15 < 1) goto LAB_00554b44;
            pvVar11 = realloc(*(void **)(__ptr + 2),(ulong)uVar15 * 8);
            *(void **)(__ptr + 2) = pvVar11;
            if (pvVar11 == (void *)0x0) goto LAB_00554e3b;
            uVar15 = uVar15 * 2;
          }
          *__ptr = uVar15;
        }
LAB_00554b44:
        *(int *)(*(long *)(__ptr + 2) + (ulong)uVar14 * 4) = (int)uVar20;
        __ptr[1] = uVar14 + 1;
      }
      uVar20 = uVar20 + 1;
      pvVar12 = s->assigns;
    } while (uVar20 < pvVar12->size);
  }
  phVar3 = s->var_order;
  pvVar4 = phVar3->data;
  if (pvVar4->size != 0) {
    puVar13 = pvVar4->data;
    pvVar5 = phVar3->indices;
    uVar20 = 0;
    do {
      if (pvVar5->size <= puVar13[uVar20]) goto LAB_00554dfd;
      pvVar5->data[puVar13[uVar20]] = -1;
      uVar20 = uVar20 + 1;
    } while (uVar20 < pvVar4->size);
  }
  pvVar4->size = 0;
  uVar15 = __ptr[1];
  if ((ulong)uVar15 != 0) {
    lVar6 = *(long *)(__ptr + 2);
    uVar20 = 0;
    do {
      uVar14 = *(uint *)(lVar6 + uVar20 * 4);
      if (phVar3->indices->size <= uVar14) goto LAB_00554dfd;
      phVar3->indices->data[uVar14] = (int)uVar20;
      pvVar4 = phVar3->data;
      uVar19 = pvVar4->cap;
      if (pvVar4->size == uVar19) {
        if (uVar19 < 0x10) {
          puVar13 = (uint *)realloc(pvVar4->data,0x40);
          pvVar4->data = puVar13;
          uVar19 = 0x10;
          if (puVar13 == (uint *)0x0) goto LAB_00554e3b;
        }
        else {
          if ((int)uVar19 < 1) goto LAB_00554c4c;
          puVar13 = (uint *)realloc(pvVar4->data,(ulong)uVar19 * 8);
          pvVar4->data = puVar13;
          if (puVar13 == (uint *)0x0) {
LAB_00554e3b:
            __assert_fail("p->data != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/satoko/utils/vec/vec_uint.h"
                          ,0x6e,"void vec_uint_reserve(vec_uint_t *, unsigned int)");
          }
          uVar19 = uVar19 * 2;
        }
        pvVar4->cap = uVar19;
      }
LAB_00554c4c:
      pvVar4->data[pvVar4->size] = uVar14;
      pvVar4->size = pvVar4->size + 1;
      uVar20 = uVar20 + 1;
    } while (uVar15 != uVar20);
  }
  pvVar4 = phVar3->data;
  if (1 < pvVar4->size) {
    uVar20 = (ulong)(pvVar4->size >> 1);
    do {
      uVar1 = uVar20 - 1;
      if (pvVar4->size <= (uint)uVar1) {
LAB_00554dde:
        __assertion = "idx >= 0 && idx < p->size";
        __file = 
        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/satoko/utils/vec/vec_uint.h"
        ;
        __function = "unsigned int vec_uint_at(vec_uint_t *, unsigned int)";
LAB_00554df3:
        __assert_fail(__assertion,__file,0x85,__function);
      }
      puVar13 = pvVar4->data;
      uVar15 = puVar13[uVar1 & 0xffffffff];
      uVar17 = uVar1 & 0xffffffff;
      do {
        uVar19 = (uint)uVar17;
        uVar18 = uVar19 * 2 + 1;
        uVar14 = pvVar4->size;
        if (uVar14 <= uVar18) break;
        uVar16 = uVar19 * 2 + 2;
        if (uVar16 < uVar14) {
          uVar2 = phVar3->weights->size;
          if ((puVar13[uVar16] < uVar2) && (puVar13[uVar18] < uVar2)) {
            psVar7 = phVar3->weights->data;
            if (psVar7[puVar13[uVar16]] <= psVar7[puVar13[uVar18]]) goto LAB_00554cec;
            goto LAB_00554cef;
          }
LAB_00554dc7:
          __assertion = "i >= 0 && i < p->size";
          __file = 
          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/satoko/utils/vec/vec_sdbl.h"
          ;
          __function = "sdbl_t vec_sdbl_at(vec_sdbl_t *, unsigned int)";
          goto LAB_00554df3;
        }
LAB_00554cec:
        uVar16 = uVar18;
LAB_00554cef:
        if (uVar14 <= uVar16) goto LAB_00554dde;
        uVar18 = puVar13[uVar16];
        uVar2 = phVar3->weights->size;
        if ((uVar2 <= uVar18) || (uVar2 <= uVar15)) goto LAB_00554dc7;
        psVar7 = phVar3->weights->data;
        uVar8 = psVar7[uVar18];
        uVar9 = psVar7[uVar15];
        if (uVar9 < uVar8) {
          if (uVar14 <= uVar19) goto LAB_00554e1c;
          puVar13[uVar17] = uVar18;
          if (pvVar4->size <= uVar19) goto LAB_00554dde;
          if (phVar3->indices->size <= uVar18) goto LAB_00554dfd;
          phVar3->indices->data[uVar18] = uVar19;
          uVar19 = uVar16;
        }
        uVar17 = (ulong)uVar19;
      } while (uVar9 < uVar8);
      if (pvVar4->size <= uVar19) {
LAB_00554e1c:
        __assert_fail("(idx >= 0) && (idx < vec_uint_size(p))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/satoko/utils/vec/vec_uint.h"
                      ,0xc2,"void vec_uint_assign(vec_uint_t *, unsigned int, unsigned int)");
      }
      puVar13[uVar19] = uVar15;
      if (phVar3->indices->size <= uVar15) {
LAB_00554dfd:
        __assert_fail("(i >= 0) && (i < vec_int_size(p))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/satoko/utils/vec/vec_int.h"
                      ,0xa6,"void vec_int_assign(vec_int_t *, unsigned int, int)");
      }
      phVar3->indices->data[uVar15] = uVar19;
      bVar10 = 1 < (long)uVar20;
      uVar20 = uVar1;
    } while (bVar10);
  }
  if (*(void **)(__ptr + 2) != (void *)0x0) {
    free(*(void **)(__ptr + 2));
    __ptr[2] = 0;
    __ptr[3] = 0;
  }
  free(__ptr);
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START

//===------------------------------------------------------------------------===
// Satoko internal functions
//===------------------------------------------------------------------------===
static inline void solver_rebuild_order(solver_t *s)
{
    unsigned var;
    vec_uint_t *vars = vec_uint_alloc(vec_char_size(s->assigns));

    for (var = 0; var < vec_char_size(s->assigns); var++)
        if (var_value(s, var) == SATOKO_VAR_UNASSING)
            vec_uint_push_back(vars, var);
    heap_build(s->var_order, vars);
    vec_uint_free(vars);
}